

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O0

void RigidBodyDynamics::Math::SparseSolveLx(Model *model,MatrixNd *L,VectorNd *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  reference pvVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  long in_RDI;
  uint j;
  uint i;
  Scalar in_stack_ffffffffffffffb8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_ffffffffffffffc0;
  undefined4 local_20;
  undefined4 local_1c;
  
  for (local_1c = 1; local_1c <= *(uint *)(in_RDI + 0x50); local_1c = local_1c + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x18),
                        (ulong)local_1c);
    local_20 = *pvVar4;
    while (local_20 != 0) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8);
      dVar1 = *pSVar5;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8,0x122eb1);
      dVar2 = *pSVar6;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8);
      dVar3 = *pSVar5;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8);
      *pSVar5 = -dVar2 * dVar3 + dVar1;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x18),
                          (ulong)local_20);
      local_20 = *pvVar4;
    }
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffb8 = *pSVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8,0x122f81);
    in_stack_ffffffffffffffc0 =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
         (in_stack_ffffffffffffffb8 / *pSVar6);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8);
    *pSVar5 = (Scalar)in_stack_ffffffffffffffc0;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void SparseSolveLx (Model &model, Math::MatrixNd &L, Math::VectorNd &x) {
	for (unsigned int i = 1; i <= model.qdot_size; i++) {
		unsigned int j = model.lambda_q[i];
		while (j != 0) {
			x[i - 1] = x[i - 1] - L(i - 1,j - 1) * x[j - 1];
			j = model.lambda_q[j];
		}
		x[i - 1] = x[i - 1] / L(i - 1,i - 1);
	}
}